

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool ON_String::IsPossibleEncoding(Encoding encoding,char *buffer,int buffer_length)

{
  int local_1c;
  int buffer_length_local;
  char *buffer_local;
  Encoding encoding_local;
  
  if (encoding == Unset) {
    buffer_local._7_1_ = false;
  }
  else if (encoding == Unknown) {
    buffer_local._7_1_ = false;
  }
  else if (buffer == (char *)0x0) {
    buffer_local._7_1_ = false;
  }
  else {
    local_1c = buffer_length;
    if (buffer_length == -1) {
      local_1c = Length(buffer);
    }
    if (local_1c == 0) {
      buffer_local._7_1_ = true;
    }
    else if (local_1c < 0) {
      buffer_local._7_1_ = false;
    }
    else {
      switch(encoding) {
      case ASCII:
        buffer_local._7_1_ = ON_IsASCIIEncoded(buffer,local_1c);
        break;
      case UTF8:
        buffer_local._7_1_ = ON_IsUTF8Encoded(false,buffer,local_1c);
        break;
      case SloppyUTF8:
        buffer_local._7_1_ = ON_IsUTF8Encoded(false,buffer,local_1c);
        break;
      case BIG5andASCII:
        buffer_local._7_1_ = ON_IsBig5Encoded(buffer,local_1c);
        break;
      default:
        buffer_local._7_1_ = false;
      }
    }
  }
  return buffer_local._7_1_;
}

Assistant:

bool ON_String::IsPossibleEncoding(
  ON_String::Encoding encoding,
  const char* buffer,
  int buffer_length
)
{
  // In practice, this is used to choose between BIG5 and UTF when parsing strings that
  // are names of components.
  // 
  // If you need something more clever like NOTPOAD++ encoding detection, then you need
  // to find a library that uses some sampling and linguistic analysis.
  if (ON_String::Encoding::Unset == encoding)
    return false;
  if (ON_String::Encoding::Unknown == encoding)
    return false;
  if (nullptr == buffer)
    return false;
  if (-1 == buffer_length)
    buffer_length = ON_String::Length(buffer);
  if (0 == buffer_length)
    return true;
  if (buffer_length < 0)
    return false;

  switch (encoding)
  {
  case ON_String::Encoding::ASCII:
    return ON_IsASCIIEncoded(buffer, buffer_length);
  case ON_String::Encoding::UTF8:
    return ON_IsUTF8Encoded(false, buffer, buffer_length);
  case ON_String::Encoding::BIG5andASCII:
    return ON_IsBig5Encoded(buffer, buffer_length);
  case ON_String::Encoding::SloppyUTF8:
    return ON_IsUTF8Encoded(false, buffer, buffer_length);
  default:
    break;
  }

  return false;
}